

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryIOWrapper.h
# Opt level: O3

aiReturn __thiscall
Assimp::MemoryIOStream::Seek(MemoryIOStream *this,size_t pOffset,aiOrigin pOrigin)

{
  if (pOrigin == aiOrigin_END) {
    if (this->length < pOffset) {
      return aiReturn_FAILURE;
    }
    this->pos = this->length - pOffset;
  }
  else {
    if (pOrigin == aiOrigin_SET) {
      if (this->length < pOffset) {
        return aiReturn_FAILURE;
      }
    }
    else {
      pOffset = pOffset + this->pos;
      if (this->length < pOffset) {
        return aiReturn_FAILURE;
      }
    }
    this->pos = pOffset;
  }
  return aiReturn_SUCCESS;
}

Assistant:

aiReturn Seek(size_t pOffset, aiOrigin pOrigin) {
        if (aiOrigin_SET == pOrigin) {
            if (pOffset > length) {
                return AI_FAILURE;
            }
            pos = pOffset;
        } else if (aiOrigin_END == pOrigin) {
            if (pOffset > length) {
                return AI_FAILURE;
            }
            pos = length-pOffset;
        } else {
            if (pOffset+pos > length) {
                return AI_FAILURE;
            }
            pos += pOffset;
        }
        return AI_SUCCESS;
    }